

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteMainCMakefileLanguageRules
          (cmGlobalUnixMakefileGenerator3 *this,cmGeneratedFileStream *cmakefileStream,
          vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
          *lGenerators)

{
  pointer puVar1;
  cmLocalUnixMakefileGenerator3 *this_00;
  pointer puVar2;
  bool bVar3;
  TargetType TVar4;
  pointer puVar5;
  ostream *poVar6;
  pointer puVar7;
  string tname;
  string local_d0;
  cmAlphaNum local_b0;
  cmAlphaNum local_80;
  string local_50;
  
  std::operator<<((ostream *)cmakefileStream,"# Dependency information for all targets:\n");
  std::operator<<((ostream *)cmakefileStream,"set(CMAKE_DEPEND_INFO_FILES\n");
  puVar1 = (lGenerators->
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (puVar5 = (lGenerators->
                super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1) {
    this_00 = (cmLocalUnixMakefileGenerator3 *)
              (puVar5->_M_t).
              super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
              super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
              super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
    puVar2 = *(pointer *)
              &((GeneratorTargetVector *)((long)&this_00->super_cmLocalCommonGenerator + 0x150))->
               super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
    ;
    for (puVar7 = *(pointer *)
                   &((GeneratorTargetVector *)((long)&this_00->super_cmLocalCommonGenerator + 0x148)
                    )->
                    super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
        ; puVar7 != puVar2; puVar7 = puVar7 + 1) {
      bVar3 = cmGeneratorTarget::IsInBuildSystem
                        ((puVar7->_M_t).
                         super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                         .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
      if (bVar3) {
        TVar4 = cmGeneratorTarget::GetType
                          ((puVar7->_M_t).
                           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                           .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
        if (TVar4 != GLOBAL_TARGET) {
          cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                    (&local_d0,this_00,
                     (puVar7->_M_t).
                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                     .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
          local_80.View_._M_len = local_d0._M_string_length;
          local_80.View_._M_str = local_d0._M_dataplus._M_p;
          local_b0.View_._M_len = 0x11;
          local_b0.View_._M_str = "/DependInfo.cmake";
          cmStrCat<>(&local_50,&local_80,&local_b0);
          std::__cxx11::string::~string((string *)&local_d0);
          cmsys::SystemTools::ConvertToUnixSlashes(&local_50);
          poVar6 = std::operator<<((ostream *)cmakefileStream,"  \"");
          poVar6 = std::operator<<(poVar6,(string *)&local_50);
          std::operator<<(poVar6,"\"\n");
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
    }
  }
  std::operator<<((ostream *)cmakefileStream,"  )\n");
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteMainCMakefileLanguageRules(
  cmGeneratedFileStream& cmakefileStream,
  std::vector<std::unique_ptr<cmLocalGenerator>>& lGenerators)
{
  // now list all the target info files
  cmakefileStream << "# Dependency information for all targets:\n";
  cmakefileStream << "set(CMAKE_DEPEND_INFO_FILES\n";
  for (const auto& lGenerator : lGenerators) {
    const auto& lg =
      cm::static_reference_cast<cmLocalUnixMakefileGenerator3>(lGenerator);
    // for all of out targets
    for (const auto& tgt : lg.GetGeneratorTargets()) {
      if (tgt->IsInBuildSystem() &&
          tgt->GetType() != cmStateEnums::GLOBAL_TARGET) {
        std::string tname = cmStrCat(lg.GetRelativeTargetDirectory(tgt.get()),
                                     "/DependInfo.cmake");
        cmSystemTools::ConvertToUnixSlashes(tname);
        cmakefileStream << "  \"" << tname << "\"\n";
      }
    }
  }
  cmakefileStream << "  )\n";
}